

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

bool __thiscall
ON_Triangle::GetTightBoundingBox
          (ON_Triangle *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  byte local_51;
  undefined1 local_48 [8];
  ON_3dPoint P;
  int i;
  bool rc;
  ON_Xform *xform_local;
  bool bGrowBox_local;
  ON_BoundingBox *tight_bbox_local;
  ON_Triangle *this_local;
  
  xform_local._7_1_ = bGrowBox;
  if ((bGrowBox) && (bVar1 = ON_BoundingBox::IsValid(tight_bbox), !bVar1)) {
    xform_local._7_1_ = 0;
  }
  P.z._7_1_ = 1;
  if ((xform == (ON_Xform *)0x0) || (bVar1 = ON_Xform::IsIdentity(xform,0.0), bVar1)) {
    P.z._7_1_ = GetBoundingBox(this,tight_bbox,(uint)(xform_local._7_1_ & 1));
  }
  else {
    for (P.z._0_4_ = 0; P.z._0_4_ < 3; P.z._0_4_ = P.z._0_4_ + 1) {
      ON_Xform::operator*((ON_3dPoint *)local_48,xform,this->m_V + P.z._0_4_);
      bVar1 = ON_BoundingBox::Set(tight_bbox,(ON_3dPoint *)local_48,(uint)(xform_local._7_1_ & 1));
      local_51 = 0;
      if (bVar1) {
        local_51 = P.z._7_1_;
      }
      P.z._7_1_ = local_51 & 1;
      xform_local._7_1_ = 1;
    }
  }
  return (bool)(P.z._7_1_ & 1);
}

Assistant:

bool ON_Triangle::GetTightBoundingBox(
	ON_BoundingBox& tight_bbox,
	bool bGrowBox,
	const ON_Xform* xform ) const
{
	if (bGrowBox && !tight_bbox.IsValid())
	{
		bGrowBox = false;
	}

	bool rc = true;
	if (xform && !xform->IsIdentity())
	{
		for (int i = 0; i < 3; i++)
		{
			ON_3dPoint P = (*xform)*m_V[i];
			rc = tight_bbox.Set(P, bGrowBox) && rc;
			bGrowBox = true;
		}
	}
	else
	{
		rc =GetBoundingBox(tight_bbox, bGrowBox);
	}

	return rc;
}